

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall despot::Variable::HasValue(Variable *this,string *value)

{
  __type_conflict _Var1;
  size_type sVar2;
  const_reference __lhs;
  int local_24;
  int i;
  string *value_local;
  Variable *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->values_);
    if (sVar2 <= (ulong)(long)local_24) {
      return false;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->values_,(long)local_24);
    _Var1 = std::operator==(__lhs,value);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

const bool Variable::HasValue(string value) const {
	for (int i = 0; i < values_.size(); i++)
		if (values_[i] == value)
			return true;
	return false;
}